

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O2

int __thiscall
pstore::sstring_view<char_const*>::compare<char_const*>(sstring_view<char_const*> *this,char **s)

{
  char *__s;
  uint uVar1;
  size_t sVar2;
  ulong __n;
  
  __s = *s;
  sVar2 = strlen(__s);
  __n = *(ulong *)(this + 8);
  if (sVar2 < *(ulong *)(this + 8)) {
    __n = sVar2;
  }
  uVar1 = __gnu_cxx::char_traits<const_char>::compare(*(char_type **)this,__s,__n);
  if (uVar1 == 0) {
    uVar1 = 0;
    if (*(ulong *)(this + 8) != sVar2) {
      uVar1 = -(uint)(*(ulong *)(this + 8) < sVar2) | 1;
    }
  }
  return uVar1;
}

Assistant:

int sstring_view<PointerType>::compare (StringType const & s) const {
        auto const slen = string_traits<StringType>::length (s);
        size_type const common_len = std::min (size (), slen);
        int result = traits::compare (data (), string_traits<StringType>::data (s), common_len);
        if (result == 0) {
            result = (size () == slen) ? 0 : (size () < slen ? -1 : 1);
        }
        return result;
    }